

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManSimulateRound(Gia_ManSim_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint *pInfo;
  bool bVar3;
  int local_24;
  int local_20;
  int iCos;
  int iCis;
  int i;
  Gia_Obj_t *pObj;
  Gia_ManSim_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  if (p->pAig->nFront < 1) {
    __assert_fail("p->pAig->nFront > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x1df,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  pGVar2 = Gia_ManConst0(p->pAig);
  if (pGVar2->Value != 0) {
    __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x1e0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  pInfo = Gia_SimData(p,0);
  Gia_ManSimInfoZero(p,pInfo);
  iCos = 1;
  while( true ) {
    bVar3 = false;
    if (iCos < p->pAig->nObjs) {
      _iCis = Gia_ManObj(p->pAig,iCos);
      bVar3 = _iCis != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAndOrConst0(_iCis);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_iCis);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjValue(_iCis);
        if (p->pAig->nFront <= iVar1) {
          __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                        ,0x1f0,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        Gia_ManSimulateCi(p,_iCis,local_20);
        local_20 = local_20 + 1;
      }
      else {
        iVar1 = Gia_ObjValue(_iCis);
        if (iVar1 != 0x1fffffff) {
          __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                        ,0x1eb,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
        }
        Gia_ManSimulateCo(p,local_24,_iCis);
        local_24 = local_24 + 1;
      }
    }
    else {
      iVar1 = Gia_ObjValue(_iCis);
      if (p->pAig->nFront <= iVar1) {
        __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                      ,0x1e6,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
      }
      Gia_ManSimulateNode(p,_iCis);
    }
    iCos = iCos + 1;
  }
  iVar1 = Gia_ManCiNum(p->pAig);
  if (iVar1 != local_20) {
    __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,500,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  iVar1 = Gia_ManCoNum(p->pAig);
  if (iVar1 != local_24) {
    __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSim.c"
                  ,0x1f5,"void Gia_ManSimulateRound(Gia_ManSim_t *)");
  }
  return;
}

Assistant:

void Gia_ManSimulateRound( Gia_ManSim_t * p )
{
    Gia_Obj_t * pObj;
    int i, iCis = 0, iCos = 0;
    assert( p->pAig->nFront > 0 );
    assert( Gia_ManConst0(p->pAig)->Value == 0 );
    Gia_ManSimInfoZero( p, Gia_SimData(p, 0) );
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAndOrConst0(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateNode( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == GIA_NONE );
            Gia_ManSimulateCo( p, iCos++, pObj );
        }
        else // if ( Gia_ObjIsCi(pObj) )
        {
            assert( Gia_ObjValue(pObj) < p->pAig->nFront );
            Gia_ManSimulateCi( p, pObj, iCis++ );
        }
    }
    assert( Gia_ManCiNum(p->pAig) == iCis );
    assert( Gia_ManCoNum(p->pAig) == iCos );
}